

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<bool>
          (TypedConfigurations *this,Level level,
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,char *confName)

{
  byte bVar1;
  bool bVar2;
  mapped_type *pmVar3;
  pointer pvVar4;
  key_type local_44;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_40;
  _Node_iterator_base<std::pair<const_el::Level,_bool>,_true> local_38;
  const_iterator it;
  char *confName_local;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *confMap_local;
  TypedConfigurations *pTStack_18;
  Level level_local;
  TypedConfigurations *this_local;
  
  it.super__Node_iterator_base<std::pair<const_el::Level,_bool>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_el::Level,_bool>,_true>)
       (_Node_iterator_base<std::pair<const_el::Level,_bool>,_true>)confName;
  confMap_local._4_4_ = level;
  pTStack_18 = this;
  local_38._M_cur =
       (__node_type *)
       utils::std::
       unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       ::find(confMap,(key_type *)((long)&confMap_local + 4));
  local_40._M_cur =
       (__node_type *)
       utils::std::
       unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       ::end(confMap);
  bVar2 = utils::std::__detail::operator==(&local_38,&local_40);
  if (bVar2) {
    local_44 = Global;
    pmVar3 = utils::std::
             unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
             ::at(confMap,&local_44);
    bVar1 = *pmVar3;
  }
  else {
    pvVar4 = utils::std::__detail::
             _Node_const_iterator<std::pair<const_el::Level,_bool>,_false,_true>::operator->
                       ((_Node_const_iterator<std::pair<const_el::Level,_bool>,_false,_true> *)
                        &local_38);
    bVar1 = pvVar4->second;
  }
  this_local._7_1_ = (bool)(bVar1 & 1);
  return this_local._7_1_;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::unordered_map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::unordered_map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }